

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

Bool ParseCSS1Selector(TidyDocImpl *doc,TidyOptionImpl *option)

{
  StreamIn *in;
  uint uVar1;
  Bool BVar2;
  int iVar3;
  ctmbstr val;
  TidyOptionId optId;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  char buf [256];
  tmbchar local_138 [264];
  
  val = local_138;
  memset(local_138,0,0x100);
  if ((doc->config).c == 0xffffffff) {
    optId = option->id;
    val = (ctmbstr)0x0;
  }
  else {
    uVar1 = SkipWhite(&doc->config);
    if (uVar1 == 0xffffffff) {
      bVar6 = true;
      uVar5 = 0;
    }
    else {
      uVar4 = 0;
      while (BVar2 = prvTidyIsWhite(uVar1), BVar2 == no) {
        local_138[uVar4] = (tmbchar)uVar1;
        if ((doc->config).c != 0xffffffff) {
          in = (doc->config).cfgIn;
          if (in == (StreamIn *)0x0) {
            uVar1 = 0xffffffff;
          }
          else {
            uVar1 = prvTidyReadChar(in);
          }
          (doc->config).c = uVar1;
        }
        uVar5 = uVar4 + 1;
        iVar3 = 1;
        if ((0xfc < uVar4) || (uVar1 = (doc->config).c, uVar4 = uVar5, uVar1 == 0xffffffff))
        goto LAB_0015659f;
      }
      iVar3 = (int)uVar4;
      uVar5 = uVar4;
LAB_0015659f:
      bVar6 = iVar3 == 0;
    }
    local_138[uVar5] = '\0';
    if (bVar6) {
      return no;
    }
    BVar2 = prvTidyIsCSS1Selector(local_138);
    if (BVar2 == no) {
      prvTidyReportBadArgument(doc,option->name);
      return no;
    }
    local_138[uVar5] = '\0';
    optId = option->id;
  }
  SetOptionValue(doc,optId,val);
  return yes;
}

Assistant:

Bool ParseCSS1Selector( TidyDocImpl* doc, const TidyOptionImpl* option )
{
    TidyConfigImpl* cfg = &doc->config;
    char buf[256] = {0};
    uint i = 0;
    uint c;

    /* Given an empty string, so signal success. */
    if ( cfg->c == EndOfStream )
    {
        SetOptionValue( doc, option->id, NULL );
        return yes;
    }

    c = SkipWhite( cfg );

    while ( i < sizeof(buf)-2 && c != EndOfStream && !TY_(IsWhite)(c) )
    {
        buf[i++] = (tmbchar) c;
        c = AdvanceChar( &doc->config );
    }
    buf[i] = '\0';

    if ( i == 0 ) {
        return no;
    }
    else if ( !TY_(IsCSS1Selector)(buf) ) {
        TY_(ReportBadArgument)( doc, option->name );
        return no;
    }

    buf[i] = 0; /* Is #697 - Do *not* add '-' */
#if 0   /* Is #697 - Is this still required? KEEP HISTORY - DO NOT DELETE */
    buf[i++] = '-';  /* Make sure any escaped Unicode is terminated */
    buf[i] = 0;      /* so valid class names are generated after */
                     /* Tidy appends last digits. */
#endif /* Is #697 - Is this still required? */

    SetOptionValue( doc, option->id, buf );
    return yes;
}